

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic_pack4.h
# Opt level: O0

void ncnn::resize_bicubic_image_pack4
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  __m128 _Dp;
  __m128 _rows3_4;
  __m128 _rows2_3;
  __m128 _rows1_2;
  __m128 _rows0_1;
  int dx_4;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1;
  __m128 _b0;
  __m128 _rows3_3;
  __m128 _rows2_2;
  __m128 _rows1_1;
  __m128 _rows0;
  __m128 _S33_3;
  __m128 _S32_3;
  __m128 _S31_3;
  __m128 _S30_3;
  __m128 _S23_2;
  __m128 _S22_2;
  __m128 _S21_2;
  __m128 _S20_2;
  __m128 _S13_1;
  __m128 _S12_1;
  __m128 _S11_1;
  __m128 _S10_1;
  __m128 _S03;
  __m128 _S02;
  __m128 _S01;
  __m128 _S00;
  __m128 _a3_3;
  __m128 _a2_3;
  __m128 _a1_3;
  __m128 _a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_3;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  __m128 _rows3_2;
  __m128 _rows2_1;
  __m128 _rows1;
  __m128 _S33_2;
  __m128 _S32_2;
  __m128 _S31_2;
  __m128 _S30_2;
  __m128 _S23_1;
  __m128 _S22_1;
  __m128 _S21_1;
  __m128 _S20_1;
  __m128 _S13;
  __m128 _S12;
  __m128 _S11;
  __m128 _S10;
  __m128 _a3_2;
  __m128 _a2_2;
  __m128 _a1_2;
  __m128 _a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_2;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  __m128 _rows3_1;
  __m128 _rows2;
  __m128 _S33_1;
  __m128 _S32_1;
  __m128 _S31_1;
  __m128 _S30_1;
  __m128 _S23;
  __m128 _S22;
  __m128 _S21;
  __m128 _S20;
  __m128 _a3_1;
  __m128 _a2_1;
  __m128 _a1_1;
  __m128 _a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_1;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  __m128 _rows3;
  __m128 _S33;
  __m128 _S32;
  __m128 _S31;
  __m128 _S30;
  __m128 _a3;
  __m128 _a2;
  __m128 _a1;
  __m128 _a0;
  float *S3p;
  int sx;
  int dx;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffe050;
  undefined8 in_stack_ffffffffffffe058;
  int _elempack;
  undefined8 **ppuVar20;
  size_t in_stack_ffffffffffffe060;
  undefined8 in_stack_ffffffffffffe068;
  int _w;
  Mat *in_stack_ffffffffffffe070;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  int local_1d04;
  undefined8 *local_1d00;
  undefined8 *local_1cf8;
  undefined8 *local_1cf0;
  undefined8 *local_1ce8;
  undefined8 *local_1ce0;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined8 uStack_1bd0;
  undefined8 local_1bc8;
  undefined8 uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined8 *local_1b18;
  undefined8 *local_1b10;
  undefined8 *local_1b08;
  undefined8 *local_1b00;
  int local_1af8;
  int local_1af4;
  undefined8 *local_1af0;
  undefined8 *local_1ae8;
  undefined8 *local_1ae0;
  undefined8 *local_1ad8;
  float *local_1ad0;
  long local_1ac8;
  long local_1ac0;
  long local_1ab8;
  long local_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  undefined8 uStack_1a30;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 *local_1978;
  undefined8 *local_1970;
  undefined8 *local_1968;
  int local_1960;
  int local_195c;
  undefined8 *local_1958;
  undefined8 *local_1950;
  undefined8 *local_1948;
  float *local_1940;
  long local_1938;
  long local_1930;
  long local_1928;
  undefined8 *local_1920;
  undefined8 *local_1918;
  undefined8 *local_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  undefined8 uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 *local_1828;
  undefined8 *local_1820;
  int local_1818;
  int local_1814;
  undefined8 *local_1810;
  undefined8 *local_1808;
  float *local_1800;
  long local_17f8;
  long local_17f0;
  undefined8 *local_17e8;
  undefined8 *local_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 *local_1740;
  int local_1738;
  int local_1734;
  undefined8 *local_1730;
  float *local_1728;
  long local_1720;
  undefined8 *local_1718;
  int local_170c;
  int local_1708;
  int local_1704;
  undefined8 *local_1700;
  undefined8 *local_16f8;
  undefined8 *local_16f0;
  undefined8 *local_16e8;
  undefined8 *local_16e0;
  int *local_16d8;
  undefined8 local_16d0;
  undefined4 local_16c8;
  long *local_16c0;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined8 local_16a0;
  undefined8 *local_1698;
  int *local_1690;
  undefined8 local_1688;
  undefined4 local_1680;
  long *local_1678;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 local_1668;
  undefined4 local_1664;
  undefined4 local_1660;
  undefined8 local_1658;
  undefined8 *local_1640;
  int *local_1638;
  undefined8 local_1630;
  undefined4 local_1628;
  long *local_1620;
  undefined4 local_1618;
  undefined4 local_1614;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined8 local_1600;
  undefined8 *local_15f8;
  int *local_15f0;
  undefined8 local_15e8;
  undefined4 local_15e0;
  long *local_15d8;
  undefined4 local_15d0;
  undefined4 local_15cc;
  undefined4 local_15c8;
  undefined4 local_15c4;
  undefined4 local_15c0;
  undefined8 local_15b8;
  int local_15b0;
  int local_15ac;
  long local_15a8;
  float *local_15a0;
  long local_1598;
  float *local_1590;
  long *local_1588;
  long *local_1580;
  undefined8 **local_1578;
  undefined8 **local_1568;
  undefined8 **local_1558;
  undefined8 **local_1548;
  undefined8 *local_1538;
  undefined8 *local_1530;
  undefined8 *local_1528;
  undefined8 *local_1520;
  undefined8 *local_1518;
  undefined8 *local_1510;
  undefined8 *local_1508;
  undefined8 *local_1500;
  undefined8 *local_14f8;
  undefined8 *local_14f0;
  undefined8 *local_14e8;
  undefined8 *local_14e0;
  undefined8 *local_14d8;
  undefined8 *local_14d0;
  undefined8 *local_14c8;
  undefined8 *local_14c0;
  undefined8 *local_14b8;
  undefined8 *local_14b0;
  undefined8 *local_14a8;
  undefined8 *local_14a0;
  undefined8 *local_1498;
  undefined8 *local_1490;
  undefined8 *local_1488;
  undefined8 *local_1480;
  undefined8 *local_1478;
  undefined8 *local_1470;
  undefined8 *local_1468;
  undefined8 *local_1460;
  undefined8 *local_1458;
  undefined8 *local_1450;
  undefined8 *local_1448;
  undefined8 *local_1440;
  undefined8 *local_1438;
  undefined8 *local_1430;
  undefined8 *local_1428;
  undefined8 *local_1420;
  undefined8 *local_1418;
  undefined8 *local_1410;
  undefined8 *local_1408;
  undefined8 *local_1400;
  undefined8 *local_13f8;
  undefined8 *local_13f0;
  undefined8 *local_13e8;
  undefined8 *local_13e0;
  int local_13d4;
  long *local_13d0;
  int local_13c4;
  long *local_13c0;
  int local_13b4;
  long *local_13b0;
  int local_13a4;
  long *local_13a0;
  int local_1394;
  long *local_1390;
  int local_1384;
  long *local_1380;
  int local_1374;
  long *local_1370;
  int local_1364;
  long *local_1360;
  int local_1354;
  long *local_1350;
  int local_1344;
  long *local_1340;
  int local_1334;
  long *local_1330;
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 *local_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined8 *local_12f0;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 *local_12d0;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 *local_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 *local_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 *local_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 *local_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 *local_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 *local_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 *local_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 *local_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_114c;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  float local_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  float local_f6c;
  float local_f68;
  float fStack_f64;
  float fStack_f60;
  float fStack_f5c;
  float local_f4c;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 *local_de0;
  undefined8 *local_dd8;
  undefined8 *local_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 *local_da0;
  undefined8 *local_d98;
  undefined8 *local_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 *local_d20;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 *local_ca0;
  undefined8 *local_c98;
  undefined8 *local_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 *local_c60;
  undefined8 *local_c58;
  undefined8 *local_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 *local_c20;
  undefined8 *local_c18;
  undefined8 *local_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 *local_ba0;
  undefined8 *local_b98;
  undefined8 *local_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 *local_b60;
  undefined8 *local_b58;
  undefined8 *local_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 *local_b20;
  undefined8 *local_b18;
  undefined8 *local_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 *local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa0;
  undefined8 *local_a98;
  undefined8 *local_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 *local_a60;
  undefined8 *local_a58;
  undefined8 *local_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 *local_a20;
  undefined8 *local_a18;
  undefined8 *local_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 *local_9e0;
  undefined8 *local_9d8;
  undefined8 *local_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_920;
  undefined8 *local_918;
  undefined8 *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 *local_820;
  undefined8 *local_818;
  undefined8 *local_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 *local_7e0;
  undefined8 *local_7d8;
  undefined8 *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a0;
  undefined8 *local_798;
  undefined8 *local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 *local_660;
  undefined8 *local_658;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 *local_620;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e0;
  undefined8 *local_5d8;
  undefined8 *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  int local_598;
  undefined4 local_594;
  undefined8 **local_590;
  int local_578;
  undefined4 local_574;
  undefined8 **local_570;
  int local_558;
  undefined4 local_554;
  undefined8 **local_550;
  int local_538;
  undefined4 local_534;
  undefined8 **local_530;
  undefined8 *local_528;
  undefined8 *local_518;
  undefined8 *local_508;
  undefined8 *local_4f8;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined8 uStack_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [16];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined8 local_288;
  undefined8 uStack_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined8 local_c0;
  undefined4 local_b4;
  undefined8 local_b0;
  int local_a4;
  undefined8 **local_a0;
  undefined8 local_98;
  undefined4 local_8c;
  undefined8 local_88;
  int local_7c;
  undefined8 **local_78;
  undefined8 local_70;
  undefined4 local_64;
  undefined8 local_60;
  int local_54;
  undefined8 **local_50;
  undefined8 local_48;
  undefined4 local_3c;
  undefined8 local_38;
  int local_2c;
  undefined8 **local_28;
  undefined8 **local_20;
  undefined8 **local_18;
  undefined8 **local_10;
  undefined8 **local_8;
  
  _w = (int)((ulong)in_stack_ffffffffffffe068 >> 0x20);
  _elempack = (int)((ulong)in_stack_ffffffffffffe058 >> 0x20);
  local_15ac = *(int *)((long)in_RSI + 0x2c);
  local_15b0 = (int)in_RSI[6];
  local_a0 = &local_15f8;
  local_b0 = 0x10;
  local_b4 = 4;
  local_c0 = 0;
  local_15f8 = (undefined8 *)0x0;
  local_15f0 = (int *)0x0;
  local_15e8 = 0;
  local_15e0 = 0;
  local_15d8 = (long *)0x0;
  local_15d0 = 0;
  local_15cc = 0;
  local_15c8 = 0;
  local_15c4 = 0;
  local_15c0 = 0;
  local_15b8 = 0;
  local_15a8 = in_R9;
  local_15a0 = in_R8;
  local_1598 = in_RCX;
  local_1590 = in_RDX;
  local_1588 = in_RSI;
  local_1580 = in_RDI;
  local_a4 = local_15ac;
  Mat::create(in_stack_ffffffffffffe070,_w,in_stack_ffffffffffffe060,_elempack,
              in_stack_ffffffffffffe050);
  local_78 = &local_1640;
  local_7c = local_15ac;
  local_88 = 0x10;
  local_8c = 4;
  local_98 = 0;
  local_1640 = (undefined8 *)0x0;
  local_1638 = (int *)0x0;
  local_1630 = 0;
  local_1628 = 0;
  local_1620 = (long *)0x0;
  local_1618 = 0;
  local_1614 = 0;
  local_1610 = 0;
  local_160c = 0;
  local_1608 = 0;
  local_1600 = 0;
  Mat::create(in_stack_ffffffffffffe070,_w,in_stack_ffffffffffffe060,_elempack,
              in_stack_ffffffffffffe050);
  local_50 = &local_1698;
  local_54 = local_15ac;
  local_60 = 0x10;
  local_64 = 4;
  local_70 = 0;
  local_1698 = (undefined8 *)0x0;
  local_1690 = (int *)0x0;
  local_1688 = 0;
  local_1680 = 0;
  local_1678 = (long *)0x0;
  local_1670 = 0;
  local_166c = 0;
  local_1668 = 0;
  local_1664 = 0;
  local_1660 = 0;
  local_1658 = 0;
  Mat::create(in_stack_ffffffffffffe070,_w,in_stack_ffffffffffffe060,_elempack,
              in_stack_ffffffffffffe050);
  local_28 = &local_16e0;
  local_2c = local_15ac;
  local_38 = 0x10;
  local_3c = 4;
  local_48 = 0;
  local_16e0 = (undefined8 *)0x0;
  local_16d8 = (int *)0x0;
  local_16d0 = 0;
  local_16c8 = 0;
  local_16c0 = (long *)0x0;
  local_16b8 = 0;
  local_16b4 = 0;
  local_16b0 = 0;
  local_16ac = 0;
  local_16a8 = 0;
  local_16a0 = 0;
  Mat::create(in_stack_ffffffffffffe070,_w,in_stack_ffffffffffffe060,_elempack,
              in_stack_ffffffffffffe050);
  local_8 = &local_15f8;
  local_16e8 = local_15f8;
  local_10 = &local_1640;
  local_16f0 = local_1640;
  local_18 = &local_1698;
  local_16f8 = local_1698;
  local_20 = &local_16e0;
  local_1700 = local_16e0;
  local_1704 = -3;
  for (local_1708 = 0; puVar3 = local_16e8, puVar2 = local_16f0, puVar1 = local_16f8,
      local_1708 < local_15b0; local_1708 = local_1708 + 1) {
    local_170c = *(int *)(local_15a8 + (long)local_1708 * 4);
    if (local_170c != local_1704) {
      if (local_170c == local_1704 + 1) {
        local_1718 = local_16e8;
        local_16e8 = local_16f0;
        local_16f0 = local_16f8;
        local_16f8 = local_1700;
        local_1700 = puVar3;
        local_1344 = local_170c + 2;
        local_1340 = local_1580;
        local_1720 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_1344 * local_1580[2];
        local_1728 = local_1590;
        local_1730 = puVar3;
        for (local_1734 = 0; local_1734 < local_15ac; local_1734 = local_1734 + 1) {
          local_1738 = *(int *)(local_1598 + (long)local_1734 * 4) << 2;
          local_1740 = (undefined8 *)(local_1720 + (long)local_1738 * 4);
          local_f68 = *local_1728;
          local_1758 = CONCAT44(local_f68,local_f68);
          uStack_1750 = CONCAT44(local_f68,local_f68);
          local_f88 = local_1728[1];
          local_1768 = CONCAT44(local_f88,local_f88);
          uStack_1760 = CONCAT44(local_f88,local_f88);
          local_fa8 = local_1728[2];
          local_1778 = CONCAT44(local_fa8,local_fa8);
          uStack_1770 = CONCAT44(local_fa8,local_fa8);
          local_fc8 = local_1728[3];
          local_1788 = CONCAT44(local_fc8,local_fc8);
          uStack_1780 = CONCAT44(local_fc8,local_fc8);
          local_13e0 = local_1740 + -2;
          local_1798 = *local_13e0;
          uStack_1790 = local_1740[-1];
          local_17a8 = *local_1740;
          uStack_17a0 = local_1740[1];
          local_13f0 = local_1740 + 2;
          local_17b8 = *local_13f0;
          uStack_17b0 = local_1740[3];
          local_13f8 = local_1740 + 4;
          local_17c8 = *local_13f8;
          uStack_17c0 = local_1740[5];
          local_df8._0_4_ = (float)local_1798;
          local_df8._4_4_ = (float)((ulong)local_1798 >> 0x20);
          uStack_df0._0_4_ = (float)uStack_1790;
          uStack_df0._4_4_ = (float)((ulong)uStack_1790 >> 0x20);
          local_17d8 = CONCAT44(local_df8._4_4_ * local_f68,(float)local_df8 * local_f68);
          uStack_17d0 = CONCAT44(uStack_df0._4_4_ * local_f68,(float)uStack_df0 * local_f68);
          local_5d0 = &local_17a8;
          local_5d8 = &local_1768;
          local_5e0 = &local_17d8;
          local_5b8._0_4_ = (float)local_17a8;
          local_5b8._4_4_ = (float)((ulong)local_17a8 >> 0x20);
          uStack_5b0._0_4_ = (float)uStack_17a0;
          uStack_5b0._4_4_ = (float)((ulong)uStack_17a0 >> 0x20);
          local_4d8 = (float)local_5b8 * local_f88;
          fStack_4d4 = local_5b8._4_4_ * local_f88;
          fStack_4d0 = (float)uStack_5b0 * local_f88;
          fStack_4cc = uStack_5b0._4_4_ * local_f88;
          local_4e8 = local_17d8;
          uStack_4e0 = uStack_17d0;
          fVar4 = local_4d8 + (float)local_df8 * local_f68;
          fVar5 = fStack_4d4 + local_df8._4_4_ * local_f68;
          fVar9 = fStack_4d0 + (float)uStack_df0 * local_f68;
          fVar19 = fStack_4cc + uStack_df0._4_4_ * local_f68;
          local_4c8 = CONCAT44(fVar5,fVar4);
          uStack_4c0 = CONCAT44(fVar19,fVar9);
          local_610 = &local_17b8;
          local_618 = &local_1778;
          local_620 = &local_17d8;
          local_5f8._0_4_ = (float)local_17b8;
          local_5f8._4_4_ = (float)((ulong)local_17b8 >> 0x20);
          uStack_5f0._0_4_ = (float)uStack_17b0;
          uStack_5f0._4_4_ = (float)((ulong)uStack_17b0 >> 0x20);
          local_4b8 = (float)local_5f8 * local_fa8;
          fStack_4b4 = local_5f8._4_4_ * local_fa8;
          fStack_4b0 = (float)uStack_5f0 * local_fa8;
          fStack_4ac = uStack_5f0._4_4_ * local_fa8;
          fVar4 = local_4b8 + fVar4;
          fVar5 = fStack_4b4 + fVar5;
          fVar9 = fStack_4b0 + fVar9;
          fVar19 = fStack_4ac + fVar19;
          local_4a8 = CONCAT44(fVar5,fVar4);
          uStack_4a0 = CONCAT44(fVar19,fVar9);
          local_650 = &local_17c8;
          local_658 = &local_1788;
          local_660 = &local_17d8;
          local_638._0_4_ = (float)local_17c8;
          local_638._4_4_ = (float)((ulong)local_17c8 >> 0x20);
          uStack_630._0_4_ = (float)uStack_17c0;
          uStack_630._4_4_ = (float)((ulong)uStack_17c0 >> 0x20);
          local_498._0_4_ = (float)local_638 * local_fc8;
          local_498._4_4_ = local_638._4_4_ * local_fc8;
          local_498._8_4_ = (float)uStack_630 * local_fc8;
          local_498._12_4_ = uStack_630._4_4_ * local_fc8;
          local_17d8 = CONCAT44(local_498._4_4_ + fVar5,local_498._0_4_ + fVar4);
          uStack_17d0 = CONCAT44(local_498._12_4_ + fVar19,local_498._8_4_ + fVar9);
          local_11d0 = (undefined8 *)((long)puVar3 + (long)(local_1734 << 2) * 4);
          *local_11d0 = local_17d8;
          local_11d0[1] = uStack_17d0;
          local_1728 = local_1728 + 4;
          local_13e8 = local_1740;
          local_11e8 = local_17d8;
          uStack_11e0 = uStack_17d0;
          fStack_fc4 = local_fc8;
          fStack_fc0 = local_fc8;
          fStack_fbc = local_fc8;
          local_fac = local_fc8;
          fStack_fa4 = local_fa8;
          fStack_fa0 = local_fa8;
          fStack_f9c = local_fa8;
          local_f8c = local_fa8;
          fStack_f84 = local_f88;
          fStack_f80 = local_f88;
          fStack_f7c = local_f88;
          local_f6c = local_f88;
          fStack_f64 = local_f68;
          fStack_f60 = local_f68;
          fStack_f5c = local_f68;
          local_f4c = local_f68;
          local_e08 = local_1758;
          uStack_e00 = uStack_1750;
          local_df8 = local_1798;
          uStack_df0 = uStack_1790;
          local_648 = local_1788;
          uStack_640 = uStack_1780;
          local_638 = local_17c8;
          uStack_630 = uStack_17c0;
          local_608 = local_1778;
          uStack_600 = uStack_1770;
          local_5f8 = local_17b8;
          uStack_5f0 = uStack_17b0;
          local_5c8 = local_1768;
          uStack_5c0 = uStack_1760;
          local_5b8 = local_17a8;
          uStack_5b0 = uStack_17a0;
        }
      }
      else if (local_170c == local_1704 + 2) {
        local_17e0 = local_16e8;
        local_17e8 = local_16f0;
        local_16e8 = local_16f8;
        local_16f0 = local_1700;
        local_16f8 = puVar3;
        local_1700 = puVar2;
        local_1354 = local_170c + 1;
        local_1350 = local_1580;
        local_17f0 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_1354 * local_1580[2];
        local_1364 = local_170c + 2;
        local_1360 = local_1580;
        local_17f8 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_1364 * local_1580[2];
        local_1800 = local_1590;
        local_1808 = puVar3;
        local_1810 = puVar2;
        for (local_1814 = 0; local_1814 < local_15ac; local_1814 = local_1814 + 1) {
          local_1818 = *(int *)(local_1598 + (long)local_1814 * 4) << 2;
          local_1820 = (undefined8 *)(local_17f0 + (long)local_1818 * 4);
          local_1828 = (undefined8 *)(local_17f8 + (long)local_1818 * 4);
          local_fe8 = *local_1800;
          local_1838 = CONCAT44(local_fe8,local_fe8);
          uStack_1830 = CONCAT44(local_fe8,local_fe8);
          local_1008 = local_1800[1];
          local_1848 = CONCAT44(local_1008,local_1008);
          uStack_1840 = CONCAT44(local_1008,local_1008);
          local_1028 = local_1800[2];
          local_1858 = CONCAT44(local_1028,local_1028);
          uStack_1850 = CONCAT44(local_1028,local_1028);
          local_1048 = local_1800[3];
          local_1868 = CONCAT44(local_1048,local_1048);
          uStack_1860 = CONCAT44(local_1048,local_1048);
          local_1400 = local_1820 + -2;
          local_1878 = *local_1400;
          uStack_1870 = local_1820[-1];
          local_1888 = *local_1820;
          uStack_1880 = local_1820[1];
          local_1410 = local_1820 + 2;
          local_1898 = *local_1410;
          uStack_1890 = local_1820[3];
          local_1418 = local_1820 + 4;
          local_18a8 = *local_1418;
          uStack_18a0 = local_1820[5];
          local_1420 = local_1828 + -2;
          local_18b8 = *local_1420;
          uStack_18b0 = local_1828[-1];
          local_18c8 = *local_1828;
          uStack_18c0 = local_1828[1];
          local_1430 = local_1828 + 2;
          local_18d8 = *local_1430;
          uStack_18d0 = local_1828[3];
          local_1438 = local_1828 + 4;
          local_18e8 = *local_1438;
          uStack_18e0 = local_1828[5];
          local_e18._0_4_ = (float)local_1878;
          local_e18._4_4_ = (float)((ulong)local_1878 >> 0x20);
          uStack_e10._0_4_ = (float)uStack_1870;
          uStack_e10._4_4_ = (float)((ulong)uStack_1870 >> 0x20);
          local_18f8 = CONCAT44(local_e18._4_4_ * local_fe8,(float)local_e18 * local_fe8);
          uStack_18f0 = CONCAT44(uStack_e10._4_4_ * local_fe8,(float)uStack_e10 * local_fe8);
          local_e38._0_4_ = (float)local_18b8;
          local_e38._4_4_ = (float)((ulong)local_18b8 >> 0x20);
          uStack_e30._0_4_ = (float)uStack_18b0;
          uStack_e30._4_4_ = (float)((ulong)uStack_18b0 >> 0x20);
          local_1908 = CONCAT44(local_e38._4_4_ * local_fe8,(float)local_e38 * local_fe8);
          uStack_1900 = CONCAT44(uStack_e30._4_4_ * local_fe8,(float)uStack_e30 * local_fe8);
          local_690 = &local_1888;
          local_698 = &local_1848;
          local_6a0 = &local_18f8;
          local_678._0_4_ = (float)local_1888;
          local_678._4_4_ = (float)((ulong)local_1888 >> 0x20);
          uStack_670._0_4_ = (float)uStack_1880;
          uStack_670._4_4_ = (float)((ulong)uStack_1880 >> 0x20);
          local_478 = (float)local_678 * local_1008;
          fStack_474 = local_678._4_4_ * local_1008;
          fStack_470 = (float)uStack_670 * local_1008;
          fStack_46c = uStack_670._4_4_ * local_1008;
          local_488 = local_18f8;
          uStack_480 = uStack_18f0;
          fVar4 = local_478 + (float)local_e18 * local_fe8;
          fVar9 = fStack_474 + local_e18._4_4_ * local_fe8;
          fVar6 = fStack_470 + (float)uStack_e10 * local_fe8;
          fVar10 = fStack_46c + uStack_e10._4_4_ * local_fe8;
          local_448 = CONCAT44(fVar9,fVar4);
          uStack_440 = CONCAT44(fVar10,fVar6);
          local_6d0 = &local_18c8;
          local_6d8 = &local_1848;
          local_6e0 = &local_1908;
          local_6b8._0_4_ = (float)local_18c8;
          local_6b8._4_4_ = (float)((ulong)local_18c8 >> 0x20);
          uStack_6b0._0_4_ = (float)uStack_18c0;
          uStack_6b0._4_4_ = (float)((ulong)uStack_18c0 >> 0x20);
          local_458 = (float)local_6b8 * local_1008;
          fStack_454 = local_6b8._4_4_ * local_1008;
          fStack_450 = (float)uStack_6b0 * local_1008;
          fStack_44c = uStack_6b0._4_4_ * local_1008;
          local_468 = local_1908;
          uStack_460 = uStack_1900;
          fVar5 = local_458 + (float)local_e38 * local_fe8;
          fVar19 = fStack_454 + local_e38._4_4_ * local_fe8;
          fVar7 = fStack_450 + (float)uStack_e30 * local_fe8;
          fVar11 = fStack_44c + uStack_e30._4_4_ * local_fe8;
          local_428 = CONCAT44(fVar19,fVar5);
          uStack_420 = CONCAT44(fVar11,fVar7);
          local_710 = &local_1898;
          local_718 = &local_1858;
          local_720 = &local_18f8;
          local_6f8._0_4_ = (float)local_1898;
          local_6f8._4_4_ = (float)((ulong)local_1898 >> 0x20);
          uStack_6f0._0_4_ = (float)uStack_1890;
          uStack_6f0._4_4_ = (float)((ulong)uStack_1890 >> 0x20);
          local_438 = (float)local_6f8 * local_1028;
          fStack_434 = local_6f8._4_4_ * local_1028;
          fStack_430 = (float)uStack_6f0 * local_1028;
          fStack_42c = uStack_6f0._4_4_ * local_1028;
          fVar4 = local_438 + fVar4;
          fVar9 = fStack_434 + fVar9;
          fVar6 = fStack_430 + fVar6;
          fVar10 = fStack_42c + fVar10;
          local_408 = CONCAT44(fVar9,fVar4);
          uStack_400 = CONCAT44(fVar10,fVar6);
          local_750 = &local_18d8;
          local_758 = &local_1858;
          local_760 = &local_1908;
          local_738._0_4_ = (float)local_18d8;
          local_738._4_4_ = (float)((ulong)local_18d8 >> 0x20);
          uStack_730._0_4_ = (float)uStack_18d0;
          uStack_730._4_4_ = (float)((ulong)uStack_18d0 >> 0x20);
          local_418 = (float)local_738 * local_1028;
          fStack_414 = local_738._4_4_ * local_1028;
          fStack_410 = (float)uStack_730 * local_1028;
          fStack_40c = uStack_730._4_4_ * local_1028;
          fVar5 = local_418 + fVar5;
          fVar19 = fStack_414 + fVar19;
          fVar7 = fStack_410 + fVar7;
          fVar11 = fStack_40c + fVar11;
          local_3e8 = CONCAT44(fVar19,fVar5);
          uStack_3e0 = CONCAT44(fVar11,fVar7);
          local_790 = &local_18a8;
          local_798 = &local_1868;
          local_7a0 = &local_18f8;
          local_778._0_4_ = (float)local_18a8;
          local_778._4_4_ = (float)((ulong)local_18a8 >> 0x20);
          uStack_770._0_4_ = (float)uStack_18a0;
          uStack_770._4_4_ = (float)((ulong)uStack_18a0 >> 0x20);
          local_3f8 = (float)local_778 * local_1048;
          fStack_3f4 = local_778._4_4_ * local_1048;
          fStack_3f0 = (float)uStack_770 * local_1048;
          fStack_3ec = uStack_770._4_4_ * local_1048;
          local_18f8 = CONCAT44(fStack_3f4 + fVar9,local_3f8 + fVar4);
          uStack_18f0 = CONCAT44(fStack_3ec + fVar10,fStack_3f0 + fVar6);
          local_7d0 = &local_18e8;
          local_7d8 = &local_1868;
          local_7e0 = &local_1908;
          local_7b8._0_4_ = (float)local_18e8;
          local_7b8._4_4_ = (float)((ulong)local_18e8 >> 0x20);
          uStack_7b0._0_4_ = (float)uStack_18e0;
          uStack_7b0._4_4_ = (float)((ulong)uStack_18e0 >> 0x20);
          local_3d8._0_4_ = (float)local_7b8 * local_1048;
          local_3d8._4_4_ = local_7b8._4_4_ * local_1048;
          local_3d8._8_4_ = (float)uStack_7b0 * local_1048;
          local_3d8._12_4_ = uStack_7b0._4_4_ * local_1048;
          local_1908 = CONCAT44(local_3d8._4_4_ + fVar19,local_3d8._0_4_ + fVar5);
          uStack_1900 = CONCAT44(local_3d8._12_4_ + fVar11,local_3d8._8_4_ + fVar7);
          local_11f0 = (undefined8 *)((long)puVar3 + (long)(local_1814 << 2) * 4);
          *local_11f0 = local_18f8;
          local_11f0[1] = uStack_18f0;
          local_1210 = (undefined8 *)((long)puVar2 + (long)(local_1814 << 2) * 4);
          *local_1210 = local_1908;
          local_1210[1] = uStack_1900;
          local_1800 = local_1800 + 4;
          local_1428 = local_1828;
          local_1408 = local_1820;
          local_1228 = local_1908;
          uStack_1220 = uStack_1900;
          local_1208 = local_18f8;
          uStack_1200 = uStack_18f0;
          fStack_1044 = local_1048;
          fStack_1040 = local_1048;
          fStack_103c = local_1048;
          local_102c = local_1048;
          fStack_1024 = local_1028;
          fStack_1020 = local_1028;
          fStack_101c = local_1028;
          local_100c = local_1028;
          fStack_1004 = local_1008;
          fStack_1000 = local_1008;
          fStack_ffc = local_1008;
          local_fec = local_1008;
          fStack_fe4 = local_fe8;
          fStack_fe0 = local_fe8;
          fStack_fdc = local_fe8;
          local_fcc = local_fe8;
          local_e48 = local_1838;
          uStack_e40 = uStack_1830;
          local_e38 = local_18b8;
          uStack_e30 = uStack_18b0;
          local_e28 = local_1838;
          uStack_e20 = uStack_1830;
          local_e18 = local_1878;
          uStack_e10 = uStack_1870;
          local_7c8 = local_1868;
          uStack_7c0 = uStack_1860;
          local_7b8 = local_18e8;
          uStack_7b0 = uStack_18e0;
          local_788 = local_1868;
          uStack_780 = uStack_1860;
          local_778 = local_18a8;
          uStack_770 = uStack_18a0;
          local_748 = local_1858;
          uStack_740 = uStack_1850;
          local_738 = local_18d8;
          uStack_730 = uStack_18d0;
          local_708 = local_1858;
          uStack_700 = uStack_1850;
          local_6f8 = local_1898;
          uStack_6f0 = uStack_1890;
          local_6c8 = local_1848;
          uStack_6c0 = uStack_1840;
          local_6b8 = local_18c8;
          uStack_6b0 = uStack_18c0;
          local_688 = local_1848;
          uStack_680 = uStack_1840;
          local_678 = local_1888;
          uStack_670 = uStack_1880;
        }
      }
      else if (local_170c == local_1704 + 3) {
        local_1910 = local_16e8;
        local_1918 = local_16f0;
        local_1920 = local_16f8;
        local_16e8 = local_1700;
        local_16f0 = puVar3;
        local_16f8 = puVar2;
        local_1700 = puVar1;
        local_1370 = local_1580;
        local_1928 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_170c * local_1580[2];
        local_1384 = local_170c + 1;
        local_1380 = local_1580;
        local_1930 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_1384 * local_1580[2];
        local_1394 = local_170c + 2;
        local_1390 = local_1580;
        local_1938 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_1394 * local_1580[2];
        local_1940 = local_1590;
        local_1948 = puVar3;
        local_1950 = puVar2;
        local_1958 = puVar1;
        for (local_195c = 0; local_1374 = local_170c, local_195c < local_15ac;
            local_195c = local_195c + 1) {
          local_1960 = *(int *)(local_1598 + (long)local_195c * 4) << 2;
          local_1968 = (undefined8 *)(local_1928 + (long)local_1960 * 4);
          local_1970 = (undefined8 *)(local_1930 + (long)local_1960 * 4);
          local_1978 = (undefined8 *)(local_1938 + (long)local_1960 * 4);
          local_1068 = *local_1940;
          local_1988 = CONCAT44(local_1068,local_1068);
          uStack_1980 = CONCAT44(local_1068,local_1068);
          local_1088 = local_1940[1];
          local_1998 = CONCAT44(local_1088,local_1088);
          uStack_1990 = CONCAT44(local_1088,local_1088);
          local_10a8 = local_1940[2];
          local_19a8 = CONCAT44(local_10a8,local_10a8);
          uStack_19a0 = CONCAT44(local_10a8,local_10a8);
          local_10c8 = local_1940[3];
          local_19b8 = CONCAT44(local_10c8,local_10c8);
          uStack_19b0 = CONCAT44(local_10c8,local_10c8);
          local_1440 = local_1968 + -2;
          local_19c8 = *local_1440;
          uStack_19c0 = local_1968[-1];
          local_19d8 = *local_1968;
          uStack_19d0 = local_1968[1];
          local_1450 = local_1968 + 2;
          local_19e8 = *local_1450;
          uStack_19e0 = local_1968[3];
          local_1458 = local_1968 + 4;
          local_19f8 = *local_1458;
          uStack_19f0 = local_1968[5];
          local_1460 = local_1970 + -2;
          local_1a08 = *local_1460;
          uStack_1a00 = local_1970[-1];
          local_1a18 = *local_1970;
          uStack_1a10 = local_1970[1];
          local_1470 = local_1970 + 2;
          local_1a28 = *local_1470;
          uStack_1a20 = local_1970[3];
          local_1478 = local_1970 + 4;
          local_1a38 = *local_1478;
          uStack_1a30 = local_1970[5];
          local_1480 = local_1978 + -2;
          local_1a48 = *local_1480;
          uStack_1a40 = local_1978[-1];
          local_1a58 = *local_1978;
          uStack_1a50 = local_1978[1];
          local_1490 = local_1978 + 2;
          local_1a68 = *local_1490;
          uStack_1a60 = local_1978[3];
          local_1498 = local_1978 + 4;
          local_1a78 = *local_1498;
          uStack_1a70 = local_1978[5];
          local_e58._0_4_ = (float)local_19c8;
          local_e58._4_4_ = (float)((ulong)local_19c8 >> 0x20);
          uStack_e50._0_4_ = (float)uStack_19c0;
          uStack_e50._4_4_ = (float)((ulong)uStack_19c0 >> 0x20);
          local_1a88 = CONCAT44(local_e58._4_4_ * local_1068,(float)local_e58 * local_1068);
          uStack_1a80 = CONCAT44(uStack_e50._4_4_ * local_1068,(float)uStack_e50 * local_1068);
          local_e78._0_4_ = (float)local_1a08;
          local_e78._4_4_ = (float)((ulong)local_1a08 >> 0x20);
          uStack_e70._0_4_ = (float)uStack_1a00;
          uStack_e70._4_4_ = (float)((ulong)uStack_1a00 >> 0x20);
          local_1a98 = CONCAT44(local_e78._4_4_ * local_1068,(float)local_e78 * local_1068);
          uStack_1a90 = CONCAT44(uStack_e70._4_4_ * local_1068,(float)uStack_e70 * local_1068);
          local_e98._0_4_ = (float)local_1a48;
          local_e98._4_4_ = (float)((ulong)local_1a48 >> 0x20);
          uStack_e90._0_4_ = (float)uStack_1a40;
          uStack_e90._4_4_ = (float)((ulong)uStack_1a40 >> 0x20);
          local_1aa8 = CONCAT44(local_e98._4_4_ * local_1068,(float)local_e98 * local_1068);
          uStack_1aa0 = CONCAT44(uStack_e90._4_4_ * local_1068,(float)uStack_e90 * local_1068);
          local_810 = &local_19d8;
          local_818 = &local_1998;
          local_820 = &local_1a88;
          local_7f8._0_4_ = (float)local_19d8;
          local_7f8._4_4_ = (float)((ulong)local_19d8 >> 0x20);
          uStack_7f0._0_4_ = (float)uStack_19d0;
          uStack_7f0._4_4_ = (float)((ulong)uStack_19d0 >> 0x20);
          local_3b8 = (float)local_7f8 * local_1088;
          fStack_3b4 = local_7f8._4_4_ * local_1088;
          fStack_3b0 = (float)uStack_7f0 * local_1088;
          fStack_3ac = uStack_7f0._4_4_ * local_1088;
          local_3c8 = local_1a88;
          uStack_3c0 = uStack_1a80;
          fVar4 = local_3b8 + (float)local_e58 * local_1068;
          fVar19 = fStack_3b4 + local_e58._4_4_ * local_1068;
          fVar10 = fStack_3b0 + (float)uStack_e50 * local_1068;
          fVar12 = fStack_3ac + uStack_e50._4_4_ * local_1068;
          local_368 = CONCAT44(fVar19,fVar4);
          uStack_360 = CONCAT44(fVar12,fVar10);
          local_850 = &local_1a18;
          local_858 = &local_1998;
          local_860 = &local_1a98;
          local_838._0_4_ = (float)local_1a18;
          local_838._4_4_ = (float)((ulong)local_1a18 >> 0x20);
          uStack_830._0_4_ = (float)uStack_1a10;
          uStack_830._4_4_ = (float)((ulong)uStack_1a10 >> 0x20);
          local_398 = (float)local_838 * local_1088;
          fStack_394 = local_838._4_4_ * local_1088;
          fStack_390 = (float)uStack_830 * local_1088;
          fStack_38c = uStack_830._4_4_ * local_1088;
          local_3a8 = local_1a98;
          uStack_3a0 = uStack_1a90;
          fVar5 = local_398 + (float)local_e78 * local_1068;
          fVar6 = fStack_394 + local_e78._4_4_ * local_1068;
          fVar11 = fStack_390 + (float)uStack_e70 * local_1068;
          fVar13 = fStack_38c + uStack_e70._4_4_ * local_1068;
          local_348 = CONCAT44(fVar6,fVar5);
          uStack_340 = CONCAT44(fVar13,fVar11);
          local_890 = &local_1a58;
          local_898 = &local_1998;
          local_8a0 = &local_1aa8;
          local_878._0_4_ = (float)local_1a58;
          local_878._4_4_ = (float)((ulong)local_1a58 >> 0x20);
          uStack_870._0_4_ = (float)uStack_1a50;
          uStack_870._4_4_ = (float)((ulong)uStack_1a50 >> 0x20);
          local_378 = (float)local_878 * local_1088;
          fStack_374 = local_878._4_4_ * local_1088;
          fStack_370 = (float)uStack_870 * local_1088;
          fStack_36c = uStack_870._4_4_ * local_1088;
          local_388 = local_1aa8;
          uStack_380 = uStack_1aa0;
          fVar9 = local_378 + (float)local_e98 * local_1068;
          fVar7 = fStack_374 + local_e98._4_4_ * local_1068;
          fVar8 = fStack_370 + (float)uStack_e90 * local_1068;
          fVar14 = fStack_36c + uStack_e90._4_4_ * local_1068;
          local_328 = CONCAT44(fVar7,fVar9);
          uStack_320 = CONCAT44(fVar14,fVar8);
          local_8d0 = &local_19e8;
          local_8d8 = &local_19a8;
          local_8e0 = &local_1a88;
          local_8b8._0_4_ = (float)local_19e8;
          local_8b8._4_4_ = (float)((ulong)local_19e8 >> 0x20);
          uStack_8b0._0_4_ = (float)uStack_19e0;
          uStack_8b0._4_4_ = (float)((ulong)uStack_19e0 >> 0x20);
          local_358 = (float)local_8b8 * local_10a8;
          fStack_354 = local_8b8._4_4_ * local_10a8;
          fStack_350 = (float)uStack_8b0 * local_10a8;
          fStack_34c = uStack_8b0._4_4_ * local_10a8;
          fVar4 = local_358 + fVar4;
          fVar19 = fStack_354 + fVar19;
          fVar10 = fStack_350 + fVar10;
          fVar12 = fStack_34c + fVar12;
          local_308 = CONCAT44(fVar19,fVar4);
          uStack_300 = CONCAT44(fVar12,fVar10);
          local_910 = &local_1a28;
          local_918 = &local_19a8;
          local_920 = &local_1a98;
          local_8f8._0_4_ = (float)local_1a28;
          local_8f8._4_4_ = (float)((ulong)local_1a28 >> 0x20);
          uStack_8f0._0_4_ = (float)uStack_1a20;
          uStack_8f0._4_4_ = (float)((ulong)uStack_1a20 >> 0x20);
          local_338 = (float)local_8f8 * local_10a8;
          fStack_334 = local_8f8._4_4_ * local_10a8;
          fStack_330 = (float)uStack_8f0 * local_10a8;
          fStack_32c = uStack_8f0._4_4_ * local_10a8;
          fVar5 = local_338 + fVar5;
          fVar6 = fStack_334 + fVar6;
          fVar11 = fStack_330 + fVar11;
          fVar13 = fStack_32c + fVar13;
          local_2e8 = CONCAT44(fVar6,fVar5);
          uStack_2e0 = CONCAT44(fVar13,fVar11);
          local_950 = &local_1a68;
          local_958 = &local_19a8;
          local_960 = &local_1aa8;
          local_938._0_4_ = (float)local_1a68;
          local_938._4_4_ = (float)((ulong)local_1a68 >> 0x20);
          uStack_930._0_4_ = (float)uStack_1a60;
          uStack_930._4_4_ = (float)((ulong)uStack_1a60 >> 0x20);
          local_318 = (float)local_938 * local_10a8;
          fStack_314 = local_938._4_4_ * local_10a8;
          fStack_310 = (float)uStack_930 * local_10a8;
          fStack_30c = uStack_930._4_4_ * local_10a8;
          fVar9 = local_318 + fVar9;
          fVar7 = fStack_314 + fVar7;
          fVar8 = fStack_310 + fVar8;
          fVar14 = fStack_30c + fVar14;
          local_2c8 = CONCAT44(fVar7,fVar9);
          uStack_2c0 = CONCAT44(fVar14,fVar8);
          local_990 = &local_19f8;
          local_998 = &local_19b8;
          local_9a0 = &local_1a88;
          local_978._0_4_ = (float)local_19f8;
          local_978._4_4_ = (float)((ulong)local_19f8 >> 0x20);
          uStack_970._0_4_ = (float)uStack_19f0;
          uStack_970._4_4_ = (float)((ulong)uStack_19f0 >> 0x20);
          local_2f8 = (float)local_978 * local_10c8;
          fStack_2f4 = local_978._4_4_ * local_10c8;
          fStack_2f0 = (float)uStack_970 * local_10c8;
          fStack_2ec = uStack_970._4_4_ * local_10c8;
          local_1a88 = CONCAT44(fStack_2f4 + fVar19,local_2f8 + fVar4);
          uStack_1a80 = CONCAT44(fStack_2ec + fVar12,fStack_2f0 + fVar10);
          local_9d0 = &local_1a38;
          local_9d8 = &local_19b8;
          local_9e0 = &local_1a98;
          local_9b8._0_4_ = (float)local_1a38;
          local_9b8._4_4_ = (float)((ulong)local_1a38 >> 0x20);
          uStack_9b0._0_4_ = (float)uStack_1a30;
          uStack_9b0._4_4_ = (float)((ulong)uStack_1a30 >> 0x20);
          local_2d8 = (float)local_9b8 * local_10c8;
          fStack_2d4 = local_9b8._4_4_ * local_10c8;
          fStack_2d0 = (float)uStack_9b0 * local_10c8;
          fStack_2cc = uStack_9b0._4_4_ * local_10c8;
          local_1a98 = CONCAT44(fStack_2d4 + fVar6,local_2d8 + fVar5);
          uStack_1a90 = CONCAT44(fStack_2cc + fVar13,fStack_2d0 + fVar11);
          local_a10 = &local_1a78;
          local_a18 = &local_19b8;
          local_a20 = &local_1aa8;
          local_9f8._0_4_ = (float)local_1a78;
          local_9f8._4_4_ = (float)((ulong)local_1a78 >> 0x20);
          uStack_9f0._0_4_ = (float)uStack_1a70;
          uStack_9f0._4_4_ = (float)((ulong)uStack_1a70 >> 0x20);
          local_2b8._0_4_ = (float)local_9f8 * local_10c8;
          local_2b8._4_4_ = local_9f8._4_4_ * local_10c8;
          local_2b8._8_4_ = (float)uStack_9f0 * local_10c8;
          local_2b8._12_4_ = uStack_9f0._4_4_ * local_10c8;
          local_1aa8 = CONCAT44(local_2b8._4_4_ + fVar7,local_2b8._0_4_ + fVar9);
          uStack_1aa0 = CONCAT44(local_2b8._12_4_ + fVar14,local_2b8._8_4_ + fVar8);
          local_1230 = (undefined8 *)((long)puVar3 + (long)(local_195c << 2) * 4);
          *local_1230 = local_1a88;
          local_1230[1] = uStack_1a80;
          local_1250 = (undefined8 *)((long)puVar2 + (long)(local_195c << 2) * 4);
          *local_1250 = local_1a98;
          local_1250[1] = uStack_1a90;
          local_1270 = (undefined8 *)((long)puVar1 + (long)(local_195c << 2) * 4);
          *local_1270 = local_1aa8;
          local_1270[1] = uStack_1aa0;
          local_1940 = local_1940 + 4;
          local_1488 = local_1978;
          local_1468 = local_1970;
          local_1448 = local_1968;
          local_1288 = local_1aa8;
          uStack_1280 = uStack_1aa0;
          local_1268 = local_1a98;
          uStack_1260 = uStack_1a90;
          local_1248 = local_1a88;
          uStack_1240 = uStack_1a80;
          fStack_10c4 = local_10c8;
          fStack_10c0 = local_10c8;
          fStack_10bc = local_10c8;
          local_10ac = local_10c8;
          fStack_10a4 = local_10a8;
          fStack_10a0 = local_10a8;
          fStack_109c = local_10a8;
          local_108c = local_10a8;
          fStack_1084 = local_1088;
          fStack_1080 = local_1088;
          fStack_107c = local_1088;
          local_106c = local_1088;
          fStack_1064 = local_1068;
          fStack_1060 = local_1068;
          fStack_105c = local_1068;
          local_104c = local_1068;
          local_ea8 = local_1988;
          uStack_ea0 = uStack_1980;
          local_e98 = local_1a48;
          uStack_e90 = uStack_1a40;
          local_e88 = local_1988;
          uStack_e80 = uStack_1980;
          local_e78 = local_1a08;
          uStack_e70 = uStack_1a00;
          local_e68 = local_1988;
          uStack_e60 = uStack_1980;
          local_e58 = local_19c8;
          uStack_e50 = uStack_19c0;
          local_a08 = local_19b8;
          uStack_a00 = uStack_19b0;
          local_9f8 = local_1a78;
          uStack_9f0 = uStack_1a70;
          local_9c8 = local_19b8;
          uStack_9c0 = uStack_19b0;
          local_9b8 = local_1a38;
          uStack_9b0 = uStack_1a30;
          local_988 = local_19b8;
          uStack_980 = uStack_19b0;
          local_978 = local_19f8;
          uStack_970 = uStack_19f0;
          local_948 = local_19a8;
          uStack_940 = uStack_19a0;
          local_938 = local_1a68;
          uStack_930 = uStack_1a60;
          local_908 = local_19a8;
          uStack_900 = uStack_19a0;
          local_8f8 = local_1a28;
          uStack_8f0 = uStack_1a20;
          local_8c8 = local_19a8;
          uStack_8c0 = uStack_19a0;
          local_8b8 = local_19e8;
          uStack_8b0 = uStack_19e0;
          local_888 = local_1998;
          uStack_880 = uStack_1990;
          local_878 = local_1a58;
          uStack_870 = uStack_1a50;
          local_848 = local_1998;
          uStack_840 = uStack_1990;
          local_838 = local_1a18;
          uStack_830 = uStack_1a10;
          local_808 = local_1998;
          uStack_800 = uStack_1990;
          local_7f8 = local_19d8;
          uStack_7f0 = uStack_19d0;
        }
      }
      else {
        local_13a4 = local_170c + -1;
        local_13a0 = local_1580;
        local_1ab0 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_13a4 * local_1580[2];
        local_13b0 = local_1580;
        local_1ab8 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_170c * local_1580[2];
        local_13c4 = local_170c + 1;
        local_13c0 = local_1580;
        local_1ac0 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_13c4 * local_1580[2];
        local_13d4 = local_170c + 2;
        local_13d0 = local_1580;
        local_1ac8 = *local_1580 +
                     (long)*(int *)((long)local_1580 + 0x2c) * (long)local_13d4 * local_1580[2];
        local_1ad0 = local_1590;
        local_1ad8 = local_16e8;
        local_1ae0 = local_16f0;
        local_1ae8 = local_16f8;
        local_1af0 = local_1700;
        for (local_1af4 = 0; local_13b4 = local_170c, local_1af4 < local_15ac;
            local_1af4 = local_1af4 + 1) {
          local_1af8 = *(int *)(local_1598 + (long)local_1af4 * 4) << 2;
          local_1b00 = (undefined8 *)(local_1ab0 + (long)local_1af8 * 4);
          local_1b08 = (undefined8 *)(local_1ab8 + (long)local_1af8 * 4);
          local_1b10 = (undefined8 *)(local_1ac0 + (long)local_1af8 * 4);
          local_1b18 = (undefined8 *)(local_1ac8 + (long)local_1af8 * 4);
          local_10e8 = *local_1ad0;
          local_1b28 = CONCAT44(local_10e8,local_10e8);
          uStack_1b20 = CONCAT44(local_10e8,local_10e8);
          local_1108 = local_1ad0[1];
          local_1b38 = CONCAT44(local_1108,local_1108);
          uStack_1b30 = CONCAT44(local_1108,local_1108);
          local_1128 = local_1ad0[2];
          local_1b48 = CONCAT44(local_1128,local_1128);
          uStack_1b40 = CONCAT44(local_1128,local_1128);
          local_1148 = local_1ad0[3];
          local_1b58 = CONCAT44(local_1148,local_1148);
          uStack_1b50 = CONCAT44(local_1148,local_1148);
          local_14a0 = local_1b00 + -2;
          local_1b68 = *local_14a0;
          uStack_1b60 = local_1b00[-1];
          local_1b78 = *local_1b00;
          uStack_1b70 = local_1b00[1];
          local_14b0 = local_1b00 + 2;
          local_1b88 = *local_14b0;
          uStack_1b80 = local_1b00[3];
          local_14b8 = local_1b00 + 4;
          local_1b98 = *local_14b8;
          uStack_1b90 = local_1b00[5];
          local_14c0 = local_1b08 + -2;
          local_1ba8 = *local_14c0;
          uStack_1ba0 = local_1b08[-1];
          local_1bb8 = *local_1b08;
          uStack_1bb0 = local_1b08[1];
          local_14d0 = local_1b08 + 2;
          local_1bc8 = *local_14d0;
          uStack_1bc0 = local_1b08[3];
          local_14d8 = local_1b08 + 4;
          local_1bd8 = *local_14d8;
          uStack_1bd0 = local_1b08[5];
          local_14e0 = local_1b10 + -2;
          local_1be8 = *local_14e0;
          uStack_1be0 = local_1b10[-1];
          local_1bf8 = *local_1b10;
          uStack_1bf0 = local_1b10[1];
          local_14f0 = local_1b10 + 2;
          local_1c08 = *local_14f0;
          uStack_1c00 = local_1b10[3];
          local_14f8 = local_1b10 + 4;
          local_1c18 = *local_14f8;
          uStack_1c10 = local_1b10[5];
          local_1500 = local_1b18 + -2;
          local_1c28 = *local_1500;
          uStack_1c20 = local_1b18[-1];
          local_1c38 = *local_1b18;
          uStack_1c30 = local_1b18[1];
          local_1510 = local_1b18 + 2;
          local_1c48 = *local_1510;
          uStack_1c40 = local_1b18[3];
          local_1518 = local_1b18 + 4;
          local_1c58 = *local_1518;
          uStack_1c50 = local_1b18[5];
          local_eb8._0_4_ = (float)local_1b68;
          local_eb8._4_4_ = (float)((ulong)local_1b68 >> 0x20);
          uStack_eb0._0_4_ = (float)uStack_1b60;
          uStack_eb0._4_4_ = (float)((ulong)uStack_1b60 >> 0x20);
          local_1c68 = CONCAT44(local_eb8._4_4_ * local_10e8,(float)local_eb8 * local_10e8);
          uStack_1c60 = CONCAT44(uStack_eb0._4_4_ * local_10e8,(float)uStack_eb0 * local_10e8);
          local_ed8._0_4_ = (float)local_1ba8;
          local_ed8._4_4_ = (float)((ulong)local_1ba8 >> 0x20);
          uStack_ed0._0_4_ = (float)uStack_1ba0;
          uStack_ed0._4_4_ = (float)((ulong)uStack_1ba0 >> 0x20);
          local_1c78 = CONCAT44(local_ed8._4_4_ * local_10e8,(float)local_ed8 * local_10e8);
          uStack_1c70 = CONCAT44(uStack_ed0._4_4_ * local_10e8,(float)uStack_ed0 * local_10e8);
          local_ef8._0_4_ = (float)local_1be8;
          local_ef8._4_4_ = (float)((ulong)local_1be8 >> 0x20);
          uStack_ef0._0_4_ = (float)uStack_1be0;
          uStack_ef0._4_4_ = (float)((ulong)uStack_1be0 >> 0x20);
          local_1c88 = CONCAT44(local_ef8._4_4_ * local_10e8,(float)local_ef8 * local_10e8);
          uStack_1c80 = CONCAT44(uStack_ef0._4_4_ * local_10e8,(float)uStack_ef0 * local_10e8);
          local_f18._0_4_ = (float)local_1c28;
          local_f18._4_4_ = (float)((ulong)local_1c28 >> 0x20);
          uStack_f10._0_4_ = (float)uStack_1c20;
          uStack_f10._4_4_ = (float)((ulong)uStack_1c20 >> 0x20);
          local_1c98 = CONCAT44(local_f18._4_4_ * local_10e8,(float)local_f18 * local_10e8);
          uStack_1c90 = CONCAT44(uStack_f10._4_4_ * local_10e8,(float)uStack_f10 * local_10e8);
          local_a50 = &local_1b78;
          local_a58 = &local_1b38;
          local_a60 = &local_1c68;
          local_a38._0_4_ = (float)local_1b78;
          local_a38._4_4_ = (float)((ulong)local_1b78 >> 0x20);
          uStack_a30._0_4_ = (float)uStack_1b70;
          uStack_a30._4_4_ = (float)((ulong)uStack_1b70 >> 0x20);
          local_298 = (float)local_a38 * local_1108;
          fStack_294 = local_a38._4_4_ * local_1108;
          fStack_290 = (float)uStack_a30 * local_1108;
          fStack_28c = uStack_a30._4_4_ * local_1108;
          local_2a8 = local_1c68;
          uStack_2a0 = uStack_1c60;
          fVar4 = local_298 + (float)local_eb8 * local_10e8;
          fVar6 = fStack_294 + local_eb8._4_4_ * local_10e8;
          fVar8 = fStack_290 + (float)uStack_eb0 * local_10e8;
          fVar15 = fStack_28c + uStack_eb0._4_4_ * local_10e8;
          local_228 = CONCAT44(fVar6,fVar4);
          uStack_220 = CONCAT44(fVar15,fVar8);
          local_a90 = &local_1bb8;
          local_a98 = &local_1b38;
          local_aa0 = &local_1c78;
          local_a78._0_4_ = (float)local_1bb8;
          local_a78._4_4_ = (float)((ulong)local_1bb8 >> 0x20);
          uStack_a70._0_4_ = (float)uStack_1bb0;
          uStack_a70._4_4_ = (float)((ulong)uStack_1bb0 >> 0x20);
          local_278 = (float)local_a78 * local_1108;
          fStack_274 = local_a78._4_4_ * local_1108;
          fStack_270 = (float)uStack_a70 * local_1108;
          fStack_26c = uStack_a70._4_4_ * local_1108;
          local_288 = local_1c78;
          uStack_280 = uStack_1c70;
          fVar5 = local_278 + (float)local_ed8 * local_10e8;
          fVar7 = fStack_274 + local_ed8._4_4_ * local_10e8;
          fVar12 = fStack_270 + (float)uStack_ed0 * local_10e8;
          fVar16 = fStack_26c + uStack_ed0._4_4_ * local_10e8;
          local_208 = CONCAT44(fVar7,fVar5);
          uStack_200 = CONCAT44(fVar16,fVar12);
          local_ad0 = &local_1bf8;
          local_ad8 = &local_1b38;
          local_ae0 = &local_1c88;
          local_ab8._0_4_ = (float)local_1bf8;
          local_ab8._4_4_ = (float)((ulong)local_1bf8 >> 0x20);
          uStack_ab0._0_4_ = (float)uStack_1bf0;
          uStack_ab0._4_4_ = (float)((ulong)uStack_1bf0 >> 0x20);
          local_258 = (float)local_ab8 * local_1108;
          fStack_254 = local_ab8._4_4_ * local_1108;
          fStack_250 = (float)uStack_ab0 * local_1108;
          fStack_24c = uStack_ab0._4_4_ * local_1108;
          local_268 = local_1c88;
          uStack_260 = uStack_1c80;
          fVar9 = local_258 + (float)local_ef8 * local_10e8;
          fVar10 = fStack_254 + local_ef8._4_4_ * local_10e8;
          fVar13 = fStack_250 + (float)uStack_ef0 * local_10e8;
          fVar17 = fStack_24c + uStack_ef0._4_4_ * local_10e8;
          local_1e8 = CONCAT44(fVar10,fVar9);
          uStack_1e0 = CONCAT44(fVar17,fVar13);
          local_b10 = &local_1c38;
          local_b18 = &local_1b38;
          local_b20 = &local_1c98;
          local_af8._0_4_ = (float)local_1c38;
          local_af8._4_4_ = (float)((ulong)local_1c38 >> 0x20);
          uStack_af0._0_4_ = (float)uStack_1c30;
          uStack_af0._4_4_ = (float)((ulong)uStack_1c30 >> 0x20);
          local_238 = (float)local_af8 * local_1108;
          fStack_234 = local_af8._4_4_ * local_1108;
          fStack_230 = (float)uStack_af0 * local_1108;
          fStack_22c = uStack_af0._4_4_ * local_1108;
          local_248 = local_1c98;
          uStack_240 = uStack_1c90;
          fVar19 = local_238 + (float)local_f18 * local_10e8;
          fVar11 = fStack_234 + local_f18._4_4_ * local_10e8;
          fVar14 = fStack_230 + (float)uStack_f10 * local_10e8;
          fVar18 = fStack_22c + uStack_f10._4_4_ * local_10e8;
          local_1c8 = CONCAT44(fVar11,fVar19);
          uStack_1c0 = CONCAT44(fVar18,fVar14);
          local_b50 = &local_1b88;
          local_b58 = &local_1b48;
          local_b60 = &local_1c68;
          local_b38._0_4_ = (float)local_1b88;
          local_b38._4_4_ = (float)((ulong)local_1b88 >> 0x20);
          uStack_b30._0_4_ = (float)uStack_1b80;
          uStack_b30._4_4_ = (float)((ulong)uStack_1b80 >> 0x20);
          local_218 = (float)local_b38 * local_1128;
          fStack_214 = local_b38._4_4_ * local_1128;
          fStack_210 = (float)uStack_b30 * local_1128;
          fStack_20c = uStack_b30._4_4_ * local_1128;
          fVar4 = local_218 + fVar4;
          fVar6 = fStack_214 + fVar6;
          fVar8 = fStack_210 + fVar8;
          fVar15 = fStack_20c + fVar15;
          local_1a8 = CONCAT44(fVar6,fVar4);
          uStack_1a0 = CONCAT44(fVar15,fVar8);
          local_b90 = &local_1bc8;
          local_b98 = &local_1b48;
          local_ba0 = &local_1c78;
          local_b78._0_4_ = (float)local_1bc8;
          local_b78._4_4_ = (float)((ulong)local_1bc8 >> 0x20);
          uStack_b70._0_4_ = (float)uStack_1bc0;
          uStack_b70._4_4_ = (float)((ulong)uStack_1bc0 >> 0x20);
          local_1f8 = (float)local_b78 * local_1128;
          fStack_1f4 = local_b78._4_4_ * local_1128;
          fStack_1f0 = (float)uStack_b70 * local_1128;
          fStack_1ec = uStack_b70._4_4_ * local_1128;
          fVar5 = local_1f8 + fVar5;
          fVar7 = fStack_1f4 + fVar7;
          fVar12 = fStack_1f0 + fVar12;
          fVar16 = fStack_1ec + fVar16;
          local_188 = CONCAT44(fVar7,fVar5);
          uStack_180 = CONCAT44(fVar16,fVar12);
          local_bd0 = &local_1c08;
          local_bd8 = &local_1b48;
          local_be0 = &local_1c88;
          local_bb8._0_4_ = (float)local_1c08;
          local_bb8._4_4_ = (float)((ulong)local_1c08 >> 0x20);
          uStack_bb0._0_4_ = (float)uStack_1c00;
          uStack_bb0._4_4_ = (float)((ulong)uStack_1c00 >> 0x20);
          local_1d8 = (float)local_bb8 * local_1128;
          fStack_1d4 = local_bb8._4_4_ * local_1128;
          fStack_1d0 = (float)uStack_bb0 * local_1128;
          fStack_1cc = uStack_bb0._4_4_ * local_1128;
          fVar9 = local_1d8 + fVar9;
          fVar10 = fStack_1d4 + fVar10;
          fVar13 = fStack_1d0 + fVar13;
          fVar17 = fStack_1cc + fVar17;
          local_168 = CONCAT44(fVar10,fVar9);
          uStack_160 = CONCAT44(fVar17,fVar13);
          local_c10 = &local_1c48;
          local_c18 = &local_1b48;
          local_c20 = &local_1c98;
          local_bf8._0_4_ = (float)local_1c48;
          local_bf8._4_4_ = (float)((ulong)local_1c48 >> 0x20);
          uStack_bf0._0_4_ = (float)uStack_1c40;
          uStack_bf0._4_4_ = (float)((ulong)uStack_1c40 >> 0x20);
          local_1b8 = (float)local_bf8 * local_1128;
          fStack_1b4 = local_bf8._4_4_ * local_1128;
          fStack_1b0 = (float)uStack_bf0 * local_1128;
          fStack_1ac = uStack_bf0._4_4_ * local_1128;
          fVar19 = local_1b8 + fVar19;
          fVar11 = fStack_1b4 + fVar11;
          fVar14 = fStack_1b0 + fVar14;
          fVar18 = fStack_1ac + fVar18;
          local_148 = CONCAT44(fVar11,fVar19);
          uStack_140 = CONCAT44(fVar18,fVar14);
          local_c50 = &local_1b98;
          local_c58 = &local_1b58;
          local_c60 = &local_1c68;
          local_c38._0_4_ = (float)local_1b98;
          local_c38._4_4_ = (float)((ulong)local_1b98 >> 0x20);
          uStack_c30._0_4_ = (float)uStack_1b90;
          uStack_c30._4_4_ = (float)((ulong)uStack_1b90 >> 0x20);
          local_198 = (float)local_c38 * local_1148;
          fStack_194 = local_c38._4_4_ * local_1148;
          fStack_190 = (float)uStack_c30 * local_1148;
          fStack_18c = uStack_c30._4_4_ * local_1148;
          local_1c68 = CONCAT44(fStack_194 + fVar6,local_198 + fVar4);
          uStack_1c60 = CONCAT44(fStack_18c + fVar15,fStack_190 + fVar8);
          local_c90 = &local_1bd8;
          local_c98 = &local_1b58;
          local_ca0 = &local_1c78;
          local_c78._0_4_ = (float)local_1bd8;
          local_c78._4_4_ = (float)((ulong)local_1bd8 >> 0x20);
          uStack_c70._0_4_ = (float)uStack_1bd0;
          uStack_c70._4_4_ = (float)((ulong)uStack_1bd0 >> 0x20);
          local_178 = (float)local_c78 * local_1148;
          fStack_174 = local_c78._4_4_ * local_1148;
          fStack_170 = (float)uStack_c70 * local_1148;
          fStack_16c = uStack_c70._4_4_ * local_1148;
          local_1c78 = CONCAT44(fStack_174 + fVar7,local_178 + fVar5);
          uStack_1c70 = CONCAT44(fStack_16c + fVar16,fStack_170 + fVar12);
          local_cd0 = &local_1c18;
          local_cd8 = &local_1b58;
          local_ce0 = &local_1c88;
          local_cb8._0_4_ = (float)local_1c18;
          local_cb8._4_4_ = (float)((ulong)local_1c18 >> 0x20);
          uStack_cb0._0_4_ = (float)uStack_1c10;
          uStack_cb0._4_4_ = (float)((ulong)uStack_1c10 >> 0x20);
          local_158 = (float)local_cb8 * local_1148;
          fStack_154 = local_cb8._4_4_ * local_1148;
          fStack_150 = (float)uStack_cb0 * local_1148;
          fStack_14c = uStack_cb0._4_4_ * local_1148;
          local_1c88 = CONCAT44(fStack_154 + fVar10,local_158 + fVar9);
          uStack_1c80 = CONCAT44(fStack_14c + fVar17,fStack_150 + fVar13);
          local_d10 = &local_1c58;
          local_d18 = &local_1b58;
          local_d20 = &local_1c98;
          local_cf8._0_4_ = (float)local_1c58;
          local_cf8._4_4_ = (float)((ulong)local_1c58 >> 0x20);
          uStack_cf0._0_4_ = (float)uStack_1c50;
          uStack_cf0._4_4_ = (float)((ulong)uStack_1c50 >> 0x20);
          local_138._0_4_ = (float)local_cf8 * local_1148;
          local_138._4_4_ = local_cf8._4_4_ * local_1148;
          local_138._8_4_ = (float)uStack_cf0 * local_1148;
          local_138._12_4_ = uStack_cf0._4_4_ * local_1148;
          local_1c98 = CONCAT44(local_138._4_4_ + fVar11,local_138._0_4_ + fVar19);
          uStack_1c90 = CONCAT44(local_138._12_4_ + fVar18,local_138._8_4_ + fVar14);
          local_1290 = (undefined8 *)((long)local_16e8 + (long)(local_1af4 << 2) * 4);
          *local_1290 = local_1c68;
          local_1290[1] = uStack_1c60;
          local_12b0 = (undefined8 *)((long)local_16f0 + (long)(local_1af4 << 2) * 4);
          *local_12b0 = local_1c78;
          local_12b0[1] = uStack_1c70;
          local_12d0 = (undefined8 *)((long)local_16f8 + (long)(local_1af4 << 2) * 4);
          *local_12d0 = local_1c88;
          local_12d0[1] = uStack_1c80;
          local_12f0 = (undefined8 *)((long)local_1700 + (long)(local_1af4 << 2) * 4);
          *local_12f0 = local_1c98;
          local_12f0[1] = uStack_1c90;
          local_1ad0 = local_1ad0 + 4;
          local_1508 = local_1b18;
          local_14e8 = local_1b10;
          local_14c8 = local_1b08;
          local_14a8 = local_1b00;
          local_1308 = local_1c98;
          uStack_1300 = uStack_1c90;
          local_12e8 = local_1c88;
          uStack_12e0 = uStack_1c80;
          local_12c8 = local_1c78;
          uStack_12c0 = uStack_1c70;
          local_12a8 = local_1c68;
          uStack_12a0 = uStack_1c60;
          fStack_1144 = local_1148;
          fStack_1140 = local_1148;
          fStack_113c = local_1148;
          local_112c = local_1148;
          fStack_1124 = local_1128;
          fStack_1120 = local_1128;
          fStack_111c = local_1128;
          local_110c = local_1128;
          fStack_1104 = local_1108;
          fStack_1100 = local_1108;
          fStack_10fc = local_1108;
          local_10ec = local_1108;
          fStack_10e4 = local_10e8;
          fStack_10e0 = local_10e8;
          fStack_10dc = local_10e8;
          local_10cc = local_10e8;
          local_f28 = local_1b28;
          uStack_f20 = uStack_1b20;
          local_f18 = local_1c28;
          uStack_f10 = uStack_1c20;
          local_f08 = local_1b28;
          uStack_f00 = uStack_1b20;
          local_ef8 = local_1be8;
          uStack_ef0 = uStack_1be0;
          local_ee8 = local_1b28;
          uStack_ee0 = uStack_1b20;
          local_ed8 = local_1ba8;
          uStack_ed0 = uStack_1ba0;
          local_ec8 = local_1b28;
          uStack_ec0 = uStack_1b20;
          local_eb8 = local_1b68;
          uStack_eb0 = uStack_1b60;
          local_d08 = local_1b58;
          uStack_d00 = uStack_1b50;
          local_cf8 = local_1c58;
          uStack_cf0 = uStack_1c50;
          local_cc8 = local_1b58;
          uStack_cc0 = uStack_1b50;
          local_cb8 = local_1c18;
          uStack_cb0 = uStack_1c10;
          local_c88 = local_1b58;
          uStack_c80 = uStack_1b50;
          local_c78 = local_1bd8;
          uStack_c70 = uStack_1bd0;
          local_c48 = local_1b58;
          uStack_c40 = uStack_1b50;
          local_c38 = local_1b98;
          uStack_c30 = uStack_1b90;
          local_c08 = local_1b48;
          uStack_c00 = uStack_1b40;
          local_bf8 = local_1c48;
          uStack_bf0 = uStack_1c40;
          local_bc8 = local_1b48;
          uStack_bc0 = uStack_1b40;
          local_bb8 = local_1c08;
          uStack_bb0 = uStack_1c00;
          local_b88 = local_1b48;
          uStack_b80 = uStack_1b40;
          local_b78 = local_1bc8;
          uStack_b70 = uStack_1bc0;
          local_b48 = local_1b48;
          uStack_b40 = uStack_1b40;
          local_b38 = local_1b88;
          uStack_b30 = uStack_1b80;
          local_b08 = local_1b38;
          uStack_b00 = uStack_1b30;
          local_af8 = local_1c38;
          uStack_af0 = uStack_1c30;
          local_ac8 = local_1b38;
          uStack_ac0 = uStack_1b30;
          local_ab8 = local_1bf8;
          uStack_ab0 = uStack_1bf0;
          local_a88 = local_1b38;
          uStack_a80 = uStack_1b30;
          local_a78 = local_1bb8;
          uStack_a70 = uStack_1bb0;
          local_a48 = local_1b38;
          uStack_a40 = uStack_1b30;
          local_a38 = local_1b78;
          uStack_a30 = uStack_1b70;
        }
      }
    }
    local_1168 = *local_15a0;
    local_1ca8 = CONCAT44(local_1168,local_1168);
    uStack_1ca0 = CONCAT44(local_1168,local_1168);
    local_1188 = local_15a0[1];
    local_1cb8 = CONCAT44(local_1188,local_1188);
    uStack_1cb0 = CONCAT44(local_1188,local_1188);
    local_11a8 = local_15a0[2];
    local_1cc8 = CONCAT44(local_11a8,local_11a8);
    uStack_1cc0 = CONCAT44(local_11a8,local_11a8);
    local_11c8 = local_15a0[3];
    local_1cd8 = CONCAT44(local_11c8,local_11c8);
    uStack_1cd0 = CONCAT44(local_11c8,local_11c8);
    local_1ce0 = local_16e8;
    local_1ce8 = local_16f0;
    local_1cf0 = local_16f8;
    local_1cf8 = local_1700;
    local_1330 = local_1588;
    local_1334 = local_1708;
    local_1d00 = (undefined8 *)
                 (*local_1588 +
                 (long)*(int *)((long)local_1588 + 0x2c) * (long)local_1708 * local_1588[2]);
    for (local_1d04 = 0; local_1d04 < local_15ac; local_1d04 = local_1d04 + 1) {
      local_1520 = local_1ce0;
      local_1d18 = *local_1ce0;
      uStack_1d10 = local_1ce0[1];
      local_1528 = local_1ce8;
      local_1d28 = *local_1ce8;
      uStack_1d20 = local_1ce8[1];
      local_1530 = local_1cf0;
      local_1d38 = *local_1cf0;
      uStack_1d30 = local_1cf0[1];
      local_1538 = local_1cf8;
      local_1d48 = *local_1cf8;
      uStack_1d40 = local_1cf8[1];
      local_f38._0_4_ = (float)local_1d18;
      local_f38._4_4_ = (float)((ulong)local_1d18 >> 0x20);
      uStack_f30._0_4_ = (float)uStack_1d10;
      uStack_f30._4_4_ = (float)((ulong)uStack_1d10 >> 0x20);
      local_1d58 = CONCAT44(local_f38._4_4_ * local_1168,(float)local_f38 * local_1168);
      uStack_1d50 = CONCAT44(uStack_f30._4_4_ * local_1168,(float)uStack_f30 * local_1168);
      local_d50 = &local_1d28;
      local_d58 = &local_1cb8;
      local_d60 = &local_1d58;
      local_d38._0_4_ = (float)local_1d28;
      local_d38._4_4_ = (float)((ulong)local_1d28 >> 0x20);
      uStack_d30._0_4_ = (float)uStack_1d20;
      uStack_d30._4_4_ = (float)((ulong)uStack_1d20 >> 0x20);
      local_118 = (float)local_d38 * local_1188;
      fStack_114 = local_d38._4_4_ * local_1188;
      fStack_110 = (float)uStack_d30 * local_1188;
      fStack_10c = uStack_d30._4_4_ * local_1188;
      local_128 = local_1d58;
      uStack_120 = uStack_1d50;
      fVar4 = local_118 + (float)local_f38 * local_1168;
      fVar5 = fStack_114 + local_f38._4_4_ * local_1168;
      fVar9 = fStack_110 + (float)uStack_f30 * local_1168;
      fVar19 = fStack_10c + uStack_f30._4_4_ * local_1168;
      local_108 = CONCAT44(fVar5,fVar4);
      uStack_100 = CONCAT44(fVar19,fVar9);
      local_d90 = &local_1d38;
      local_d98 = &local_1cc8;
      local_da0 = &local_1d58;
      local_d78._0_4_ = (float)local_1d38;
      local_d78._4_4_ = (float)((ulong)local_1d38 >> 0x20);
      uStack_d70._0_4_ = (float)uStack_1d30;
      uStack_d70._4_4_ = (float)((ulong)uStack_1d30 >> 0x20);
      local_f8 = (float)local_d78 * local_11a8;
      fStack_f4 = local_d78._4_4_ * local_11a8;
      fStack_f0 = (float)uStack_d70 * local_11a8;
      fStack_ec = uStack_d70._4_4_ * local_11a8;
      fVar4 = local_f8 + fVar4;
      fVar5 = fStack_f4 + fVar5;
      fVar9 = fStack_f0 + fVar9;
      fVar19 = fStack_ec + fVar19;
      local_e8 = CONCAT44(fVar5,fVar4);
      uStack_e0 = CONCAT44(fVar19,fVar9);
      local_dd0 = &local_1d48;
      local_dd8 = &local_1cd8;
      local_de0 = &local_1d58;
      local_db8._0_4_ = (float)local_1d48;
      local_db8._4_4_ = (float)((ulong)local_1d48 >> 0x20);
      uStack_db0._0_4_ = (float)uStack_1d40;
      uStack_db0._4_4_ = (float)((ulong)uStack_1d40 >> 0x20);
      local_d8._0_4_ = (float)local_db8 * local_11c8;
      local_d8._4_4_ = local_db8._4_4_ * local_11c8;
      local_d8._8_4_ = (float)uStack_db0 * local_11c8;
      local_d8._12_4_ = uStack_db0._4_4_ * local_11c8;
      local_1d58 = CONCAT44(local_d8._4_4_ + fVar5,local_d8._0_4_ + fVar4);
      uStack_1d50 = CONCAT44(local_d8._12_4_ + fVar19,local_d8._8_4_ + fVar9);
      local_1310 = local_1d00;
      *local_1d00 = local_1d58;
      local_1d00[1] = uStack_1d50;
      local_1d00 = local_1d00 + 2;
      local_1ce0 = local_1ce0 + 2;
      local_1ce8 = local_1ce8 + 2;
      local_1cf0 = local_1cf0 + 2;
      local_1cf8 = local_1cf8 + 2;
      local_1328 = local_1d58;
      uStack_1320 = uStack_1d50;
      local_f48 = local_1ca8;
      uStack_f40 = uStack_1ca0;
      local_f38 = local_1d18;
      uStack_f30 = uStack_1d10;
      local_dc8 = local_1cd8;
      uStack_dc0 = uStack_1cd0;
      local_db8 = local_1d48;
      uStack_db0 = uStack_1d40;
      local_d88 = local_1cc8;
      uStack_d80 = uStack_1cc0;
      local_d78 = local_1d38;
      uStack_d70 = uStack_1d30;
      local_d48 = local_1cb8;
      uStack_d40 = uStack_1cb0;
      local_d38 = local_1d28;
      uStack_d30 = uStack_1d20;
    }
    local_15a0 = local_15a0 + 4;
    local_1704 = local_170c;
    fStack_11c4 = local_11c8;
    fStack_11c0 = local_11c8;
    fStack_11bc = local_11c8;
    local_11ac = local_11c8;
    fStack_11a4 = local_11a8;
    fStack_11a0 = local_11a8;
    fStack_119c = local_11a8;
    local_118c = local_11a8;
    fStack_1184 = local_1188;
    fStack_1180 = local_1188;
    fStack_117c = local_1188;
    local_116c = local_1188;
    fStack_1164 = local_1168;
    fStack_1160 = local_1168;
    fStack_115c = local_1168;
    local_114c = local_1168;
  }
  ppuVar20 = &local_16e0;
  local_1578 = ppuVar20;
  local_530 = ppuVar20;
  if (local_16d8 != (int *)0x0) {
    local_534 = 0xffffffff;
    LOCK();
    local_538 = *local_16d8;
    *local_16d8 = *local_16d8 + -1;
    UNLOCK();
    if (local_538 == 1) {
      if (local_16c0 == (long *)0x0) {
        local_528 = local_16e0;
        if (local_16e0 != (undefined8 *)0x0) {
          free(local_16e0);
        }
      }
      else {
        (**(code **)(*local_16c0 + 0x18))(local_16c0,local_16e0);
      }
    }
  }
  *ppuVar20 = (undefined8 *)0x0;
  ppuVar20[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar20 + 3) = 0;
  *(undefined4 *)(ppuVar20 + 5) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x2c) = 0;
  *(undefined4 *)(ppuVar20 + 6) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x34) = 0;
  *(undefined4 *)(ppuVar20 + 7) = 0;
  ppuVar20[8] = (undefined8 *)0x0;
  ppuVar20[1] = (undefined8 *)0x0;
  ppuVar20 = &local_1698;
  local_1568 = ppuVar20;
  local_550 = ppuVar20;
  if (local_1690 != (int *)0x0) {
    local_554 = 0xffffffff;
    LOCK();
    local_558 = *local_1690;
    *local_1690 = *local_1690 + -1;
    UNLOCK();
    if (local_558 == 1) {
      if (local_1678 == (long *)0x0) {
        local_518 = local_1698;
        if (local_1698 != (undefined8 *)0x0) {
          free(local_1698);
        }
      }
      else {
        (**(code **)(*local_1678 + 0x18))(local_1678,local_1698);
      }
    }
  }
  *ppuVar20 = (undefined8 *)0x0;
  ppuVar20[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar20 + 3) = 0;
  *(undefined4 *)(ppuVar20 + 5) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x2c) = 0;
  *(undefined4 *)(ppuVar20 + 6) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x34) = 0;
  *(undefined4 *)(ppuVar20 + 7) = 0;
  ppuVar20[8] = (undefined8 *)0x0;
  ppuVar20[1] = (undefined8 *)0x0;
  ppuVar20 = &local_1640;
  local_1558 = ppuVar20;
  local_570 = ppuVar20;
  if (local_1638 != (int *)0x0) {
    local_574 = 0xffffffff;
    LOCK();
    local_578 = *local_1638;
    *local_1638 = *local_1638 + -1;
    UNLOCK();
    if (local_578 == 1) {
      if (local_1620 == (long *)0x0) {
        local_508 = local_1640;
        if (local_1640 != (undefined8 *)0x0) {
          free(local_1640);
        }
      }
      else {
        (**(code **)(*local_1620 + 0x18))(local_1620,local_1640);
      }
    }
  }
  *ppuVar20 = (undefined8 *)0x0;
  ppuVar20[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar20 + 3) = 0;
  *(undefined4 *)(ppuVar20 + 5) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x2c) = 0;
  *(undefined4 *)(ppuVar20 + 6) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x34) = 0;
  *(undefined4 *)(ppuVar20 + 7) = 0;
  ppuVar20[8] = (undefined8 *)0x0;
  ppuVar20[1] = (undefined8 *)0x0;
  ppuVar20 = &local_15f8;
  if (local_15f0 != (int *)0x0) {
    local_594 = 0xffffffff;
    LOCK();
    local_598 = *local_15f0;
    *local_15f0 = *local_15f0 + -1;
    UNLOCK();
    if (local_598 == 1) {
      local_1548 = ppuVar20;
      local_590 = ppuVar20;
      if (local_15d8 == (long *)0x0) {
        local_4f8 = local_15f8;
        if (local_15f8 != (undefined8 *)0x0) {
          free(local_15f8);
        }
      }
      else {
        (**(code **)(*local_15d8 + 0x18))(local_15d8,local_15f8);
      }
    }
  }
  *ppuVar20 = (undefined8 *)0x0;
  ppuVar20[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar20 + 3) = 0;
  *(undefined4 *)(ppuVar20 + 5) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x2c) = 0;
  *(undefined4 *)(ppuVar20 + 6) = 0;
  *(undefined4 *)((long)ppuVar20 + 0x34) = 0;
  *(undefined4 *)(ppuVar20 + 7) = 0;
  ppuVar20[8] = (undefined8 *)0x0;
  ppuVar20[1] = (undefined8 *)0x0;
  return;
}

Assistant:

static void resize_bicubic_image_pack4(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)4 * 4u, 4);
    Mat rowsbuf1(w, (size_t)4 * 4u, 4);
    Mat rowsbuf2(w, (size_t)4 * 4u, 4);
    Mat rowsbuf3(w, (size_t)4 * 4u, 4);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S20 = _mm_load_ps(S2p - 4);
                __m128 _S21 = _mm_load_ps(S2p + 0);
                __m128 _S22 = _mm_load_ps(S2p + 4);
                __m128 _S23 = _mm_load_ps(S2p + 8);
                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows2 = _mm_mul_ps(_S20, _a0);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows2 = _mm_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows2 = _mm_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows2 = _mm_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows2p + dx * 4, _rows2);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S10 = _mm_load_ps(S1p - 4);
                __m128 _S11 = _mm_load_ps(S1p + 0);
                __m128 _S12 = _mm_load_ps(S1p + 4);
                __m128 _S13 = _mm_load_ps(S1p + 8);
                __m128 _S20 = _mm_load_ps(S2p - 4);
                __m128 _S21 = _mm_load_ps(S2p + 0);
                __m128 _S22 = _mm_load_ps(S2p + 4);
                __m128 _S23 = _mm_load_ps(S2p + 8);
                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                __m128 _rows2 = _mm_mul_ps(_S20, _a0);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows1 = _mm_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows1 = _mm_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows1p + dx * 4, _rows1);
                _mm_store_ps(rows2p + dx * 4, _rows2);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx] * 4;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                __m128 _a0 = _mm_set1_ps(alphap[0]);
                __m128 _a1 = _mm_set1_ps(alphap[1]);
                __m128 _a2 = _mm_set1_ps(alphap[2]);
                __m128 _a3 = _mm_set1_ps(alphap[3]);

                __m128 _S00 = _mm_load_ps(S0p - 4);
                __m128 _S01 = _mm_load_ps(S0p + 0);
                __m128 _S02 = _mm_load_ps(S0p + 4);
                __m128 _S03 = _mm_load_ps(S0p + 8);
                __m128 _S10 = _mm_load_ps(S1p - 4);
                __m128 _S11 = _mm_load_ps(S1p + 0);
                __m128 _S12 = _mm_load_ps(S1p + 4);
                __m128 _S13 = _mm_load_ps(S1p + 8);
                __m128 _S20 = _mm_load_ps(S2p - 4);
                __m128 _S21 = _mm_load_ps(S2p + 0);
                __m128 _S22 = _mm_load_ps(S2p + 4);
                __m128 _S23 = _mm_load_ps(S2p + 8);
                __m128 _S30 = _mm_load_ps(S3p - 4);
                __m128 _S31 = _mm_load_ps(S3p + 0);
                __m128 _S32 = _mm_load_ps(S3p + 4);
                __m128 _S33 = _mm_load_ps(S3p + 8);
                __m128 _rows0 = _mm_mul_ps(_S00, _a0);
                __m128 _rows1 = _mm_mul_ps(_S10, _a0);
                __m128 _rows2 = _mm_mul_ps(_S20, _a0);
                __m128 _rows3 = _mm_mul_ps(_S30, _a0);
                _rows0 = _mm_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S11, _a1, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S21, _a1, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S31, _a1, _rows3);
                _rows0 = _mm_comp_fmadd_ps(_S02, _a2, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S12, _a2, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S22, _a2, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S32, _a2, _rows3);
                _rows0 = _mm_comp_fmadd_ps(_S03, _a3, _rows0);
                _rows1 = _mm_comp_fmadd_ps(_S13, _a3, _rows1);
                _rows2 = _mm_comp_fmadd_ps(_S23, _a3, _rows2);
                _rows3 = _mm_comp_fmadd_ps(_S33, _a3, _rows3);
                _mm_store_ps(rows0p + dx * 4, _rows0);
                _mm_store_ps(rows1p + dx * 4, _rows1);
                _mm_store_ps(rows2p + dx * 4, _rows2);
                _mm_store_ps(rows3p + dx * 4, _rows3);

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m128 _b0 = _mm_set1_ps(beta[0]);
        __m128 _b1 = _mm_set1_ps(beta[1]);
        __m128 _b2 = _mm_set1_ps(beta[2]);
        __m128 _b3 = _mm_set1_ps(beta[3]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m128 _rows0 = _mm_load_ps(rows0p);
            __m128 _rows1 = _mm_load_ps(rows1p);
            __m128 _rows2 = _mm_load_ps(rows2p);
            __m128 _rows3 = _mm_load_ps(rows3p);
            __m128 _Dp = _mm_mul_ps(_rows0, _b0);
            _Dp = _mm_comp_fmadd_ps(_rows1, _b1, _Dp);
            _Dp = _mm_comp_fmadd_ps(_rows2, _b2, _Dp);
            _Dp = _mm_comp_fmadd_ps(_rows3, _b3, _Dp);
            _mm_store_ps(Dp, _Dp);

            Dp += 4;
            rows0p += 4;
            rows1p += 4;
            rows2p += 4;
            rows3p += 4;
        }

        beta += 4;
    }
}